

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
args::
Wrap<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,args *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          begin,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                end,size_type width,size_type firstlinewidth,size_type firstlineindent)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  long lVar4;
  string *__range1;
  string line;
  value_type local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)firstlinewidth);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this != begin._M_current)
  {
    if (width == 0) {
      width = (size_type)end._M_current;
    }
    bVar1 = true;
    do {
      if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)->
          _M_string_length != 0) {
        iVar2 = std::__cxx11::string::compare((char *)this);
        if (iVar2 == 0) {
          if (!bVar1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(__return_storage_ptr__,&local_50);
            local_50._M_string_length = 0;
            *local_50._M_dataplus._M_p = '\0';
            bVar1 = true;
            width = (size_type)end._M_current;
          }
        }
        else {
          if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)->
              _M_string_length == 0) {
            lVar4 = 0;
          }
          else {
            sVar3 = 0;
            lVar4 = 0;
            do {
              lVar4 = lVar4 + 1;
              sVar3 = sVar3 + 1;
            } while (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)->
                     _M_string_length != sVar3);
          }
          if ((width < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_50._M_string_length + lVar4 + 1)) && (!bVar1)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(__return_storage_ptr__,&local_50);
            local_50._M_string_length = 0;
            *local_50._M_dataplus._M_p = '\0';
            bVar1 = true;
            width = (size_type)end._M_current;
          }
          if (lVar4 != 0) {
            if (!bVar1) {
              std::__cxx11::string::push_back((char)&local_50);
            }
            std::__cxx11::string::_M_append
                      ((char *)&local_50,
                       (ulong)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this)->_M_dataplus)._M_p);
            bVar1 = false;
          }
        }
      }
      this = (args *)((long)this + 0x20);
    } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this !=
             begin._M_current);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_50);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> Wrap(It begin,
                                         It end,
                                         const std::string::size_type width,
                                         std::string::size_type firstlinewidth = 0,
                                         std::string::size_type firstlineindent = 0)
    {
        std::vector<std::string> output;
        std::string line(firstlineindent, ' ');
        bool empty = true;

        if (firstlinewidth == 0)
        {
            firstlinewidth = width;
        }

        auto currentwidth = firstlinewidth;

        for (auto it = begin; it != end; ++it)
        {
            if (it->empty())
            {
                continue;
            }

            if (*it == "\n")
            {
                if (!empty)
                {
                    output.push_back(line);
                    line.clear();
                    empty = true;
                    currentwidth = width;
                }

                continue;
            }

            auto itemsize = Glyphs(*it);
            if ((line.length() + 1 + itemsize) > currentwidth)
            {
                if (!empty)
                {
                    output.push_back(line);
                    line.clear();
                    empty = true;
                    currentwidth = width;
                }
            }

            if (itemsize > 0)
            {
                if (!empty)
                {
                    line += ' ';
                }

                line += *it;
                empty = false;
            }
        }

        if (!empty)
        {
            output.push_back(line);
        }

        return output;
    }